

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefTest
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,RefTest *curr)

{
  BasicHeapType BVar1;
  HeapType heapType;
  HeapType local_30;
  Type local_28;
  
  local_30 = wasm::Type::getHeapType(&curr->castType);
  BVar1 = HeapType::getTop(&local_30);
  heapType.id._4_4_ = 0;
  heapType.id._0_4_ = BVar1;
  wasm::Type::Type(&local_28,heapType,Nullable,Inexact);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->ref,local_28);
  return;
}

Assistant:

void visitRefTest(RefTest* curr) {
    auto top = curr->castType.getHeapType().getTop();
    note(&curr->ref, Type(top, Nullable));
  }